

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder.c
# Opt level: O2

void av1_set_svc_seq_params(AV1_PRIMARY *ppi)

{
  bool bVar1;
  long lVar2;
  long lVar3;
  uint uVar4;
  long lVar5;
  
  if ((ppi->seq_params).operating_points_cnt_minus_1 == 0) {
    (ppi->seq_params).operating_point_idc[0] = 0;
    bVar1 = false;
  }
  else {
    lVar3 = 0;
    for (uVar4 = 0; uVar4 < ppi->number_spatial_layers; uVar4 = uVar4 + 1) {
      lVar5 = 0;
      for (lVar2 = 0; (uint)lVar2 < ppi->number_temporal_layers; lVar2 = lVar2 + 1) {
        (ppi->seq_params).operating_point_idc[(int)lVar3 + lVar2] =
             ~(-1 << ((char)ppi->number_temporal_layers + (char)lVar5 & 0x1fU)) |
             ~(-1 << ((char)ppi->number_spatial_layers - (char)uVar4 & 0x1fU)) << 8;
        lVar5 = lVar5 + -1;
      }
      lVar3 = (int)lVar3 - lVar5;
    }
    bVar1 = true;
  }
  (ppi->seq_params).has_nonzero_operating_point_idc = bVar1;
  return;
}

Assistant:

void av1_set_svc_seq_params(AV1_PRIMARY *const ppi) {
  SequenceHeader *const seq = &ppi->seq_params;
  if (seq->operating_points_cnt_minus_1 == 0) {
    seq->operating_point_idc[0] = 0;
    seq->has_nonzero_operating_point_idc = false;
  } else {
    // Set operating_point_idc[] such that the i=0 point corresponds to the
    // highest quality operating point (all layers), and subsequent
    // operarting points (i > 0) are lower quality corresponding to
    // skip decoding enhancement  layers (temporal first).
    int i = 0;
    assert(seq->operating_points_cnt_minus_1 ==
           (int)(ppi->number_spatial_layers * ppi->number_temporal_layers - 1));
    for (unsigned int sl = 0; sl < ppi->number_spatial_layers; sl++) {
      for (unsigned int tl = 0; tl < ppi->number_temporal_layers; tl++) {
        seq->operating_point_idc[i] =
            (~(~0u << (ppi->number_spatial_layers - sl)) << 8) |
            ~(~0u << (ppi->number_temporal_layers - tl));
        assert(seq->operating_point_idc[i] != 0);
        i++;
      }
    }
    seq->has_nonzero_operating_point_idc = true;
  }
}